

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O3

void __thiscall unitOps_root_Test::~unitOps_root_Test(unitOps_root_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(unitOps, root)
{
    EXPECT_EQ(root(m, 0), one);
    auto m1 = m.pow(1);
    EXPECT_EQ(m, root(m1, 1));
    EXPECT_EQ(m.inv(), root(m1, -1));
    auto m2 = pow(m, 2);
    EXPECT_EQ(m, root(m2, 2));

    EXPECT_EQ(m, sqrt(m2));

    auto m4 = m.pow(4);
    EXPECT_EQ(m * m, root(m4, 2));
    EXPECT_EQ(m, root(m4, 4));

    auto ft1 = ft.pow(1);
    EXPECT_EQ(ft, root(ft1, 1));
    EXPECT_EQ(ft.inv(), root(ft1, -1));

    auto ft2 = ft.pow(2);
    EXPECT_EQ(ft, root(ft2, 2));
    EXPECT_EQ(ft.inv(), root(ft2, -2));
    auto ft3 = ft.pow(3);
    EXPECT_EQ(ft, root(ft3, 3));
    EXPECT_EQ(ft.inv(), root(ft3, -3));
    auto ft4 = ft.pow(4);
    EXPECT_EQ(ft * ft, root(ft4, 2));
    EXPECT_EQ(ft, root(ft4, 4));
    EXPECT_EQ(ft.inv(), root(ft4, -4));

    auto ft5 = ft.pow(5);
    EXPECT_EQ(ft, root(ft5, 5));
    EXPECT_EQ(ft.inv(), root(ft5, -5));

    EXPECT_EQ(root(unit(-4.5, m), 2), error);
}